

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
rcdiscover::WOL::appendMagicPacket
          (WOL *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sendbuf,
          array<unsigned_char,_4UL> *password)

{
  pointer *ppuVar1;
  uchar *__args;
  iterator iVar2;
  undefined8 in_RAX;
  int iVar3;
  int i;
  size_t j;
  long lVar4;
  int i_1;
  undefined8 uStack_38;
  
  iVar3 = 6;
  uStack_38 = in_RAX;
  do {
    uStack_38 = CONCAT17(0xff,(undefined7)uStack_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (sendbuf,(uchar *)((long)&uStack_38 + 7));
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = 0;
  do {
    lVar4 = 0;
    do {
      __args = (this->hardware_addr_)._M_elems + lVar4;
      iVar2._M_current =
           (sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)sendbuf,iVar2,__args);
      }
      else {
        *iVar2._M_current = *__args;
        ppuVar1 = &(sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x10);
  if (password != (array<unsigned_char,_4UL> *)0x0) {
    lVar4 = 0;
    do {
      iVar2._M_current =
           (sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)sendbuf,iVar2,
                   password->_M_elems + lVar4);
      }
      else {
        *iVar2._M_current = password->_M_elems[lVar4];
        ppuVar1 = &(sendbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  return sendbuf;
}

Assistant:

std::vector<uint8_t>& WOL::appendMagicPacket(
    std::vector<uint8_t>& sendbuf,
    const std::array<uint8_t, 4> *password) const
{
  for (int i = 0; i < 6; ++i)
  {
    sendbuf.push_back(0xFF);
  }
  for (int i = 0; i < 16; ++i)
  {
    for (size_t j = 0; j < hardware_addr_.size(); ++j)
    {
      sendbuf.push_back(hardware_addr_[j]);
    }
  }
  if (password != nullptr)
  {
    for (int i = 0; i < 4; ++i)
    {
      sendbuf.push_back((*password)[i]);
    }
  }

  return sendbuf;
}